

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::RemoveLogSink(LogSink *destination)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)sink_mutex_);
  if (sinks_ != (long *)0x0) {
    lVar1 = *sinks_;
    uVar2 = (ulong)(sinks_[1] - lVar1) >> 3 & 0xffffffff;
    do {
      uVar2 = uVar2 - 1;
      if ((int)(uint)uVar2 < 0) goto LAB_00118411;
      uVar3 = (ulong)((uint)uVar2 & 0x7fffffff);
    } while (*(LogSink **)(lVar1 + uVar3 * 8) != destination);
    *(undefined8 *)(lVar1 + uVar3 * 8) = *(undefined8 *)(lVar1 + -8 + (sinks_[1] - lVar1));
    sinks_[1] = sinks_[1] + -8;
  }
LAB_00118411:
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::RemoveLogSink(LogSink *destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&sink_mutex_);
  // This doesn't keep the sinks in order, but who cares?
  if (sinks_) {
    for (int i = sinks_->size() - 1; i >= 0; i--) {
      if ((*sinks_)[i] == destination) {
        (*sinks_)[i] = (*sinks_)[sinks_->size() - 1];
        sinks_->pop_back();
        break;
      }
    }
  }
}